

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::Deconvolution_x86_avx::create_pipeline(Deconvolution_x86_avx *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  ulong uVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long *in_RDI;
  float *k00;
  int j;
  int i_1;
  int k_1;
  int p_1;
  float *g00;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int elempack;
  int k;
  int i;
  float *p;
  float *pt;
  Mat weight_data_transposed;
  int num_input;
  int maxk;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffb68;
  size_t in_stack_fffffffffffffb70;
  void **ppvVar6;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  Mat *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  Mat *in_stack_fffffffffffffb90;
  int local_418;
  int local_414;
  Allocator *_allocator;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined4 local_3c8;
  undefined4 local_3bc;
  Allocator *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc60;
  int iVar7;
  int in_stack_fffffffffffffc64;
  int iVar8;
  undefined4 in_stack_fffffffffffffc68;
  int iVar9;
  undefined4 in_stack_fffffffffffffc6c;
  int iVar10;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined4 local_378;
  long local_370;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined8 local_350;
  undefined4 *local_348;
  int local_33c;
  void *local_338;
  int *local_330;
  long local_328;
  long *local_318;
  int local_30c;
  int local_308;
  long local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  Allocator *local_2e0;
  void *local_2c8;
  void *local_2c0;
  int *local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  long *local_2a0;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined8 local_280;
  int local_278;
  int local_274;
  byte *local_270;
  undefined8 local_260;
  undefined8 local_258;
  undefined4 local_24c;
  void **local_248;
  undefined8 *local_240;
  void **local_238;
  undefined8 *local_230;
  undefined1 local_225;
  int local_224;
  void **local_220;
  undefined8 *local_218;
  undefined1 local_20d;
  int local_20c;
  long *local_208;
  undefined8 *local_200;
  undefined8 *local_1e8;
  undefined8 *local_1d8;
  void **local_1c8;
  void **local_1b8;
  int local_1a4;
  undefined8 *local_1a0;
  int local_188;
  undefined4 local_184;
  void **local_180;
  int local_168;
  undefined4 local_164;
  void **local_160;
  undefined8 *local_140;
  undefined8 *local_120;
  int local_f8;
  undefined4 local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  void *local_98;
  undefined8 *local_80;
  undefined4 local_74;
  long local_70;
  undefined4 local_64;
  long local_60;
  void *local_58;
  void *local_10;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_274 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  uVar4 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110) / (long)local_274;
  local_278 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                   (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  local_24c = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x18c);
  local_248 = &local_2c0;
  local_258 = 4;
  local_260 = 0;
  local_2c0 = (void *)0x0;
  local_2b8 = (int *)0x0;
  local_2b0 = 0;
  local_2a8 = 0;
  local_2a0 = (long *)0x0;
  local_298 = 0;
  local_294 = 0;
  local_290 = 0;
  local_28c = 0;
  local_288 = 0;
  local_280 = 0;
  local_270 = in_RSI;
  Mat::create(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb70,
              in_stack_fffffffffffffb68);
  iVar9 = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  iVar10 = (int)(in_stack_fffffffffffffb70 >> 0x20);
  local_238 = &local_2c0;
  local_2c8 = local_2c0;
  local_230 = (undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x160);
  _allocator = (Allocator *)*local_230;
  local_2e0 = _allocator;
  for (local_2e4 = 0;
      local_2e4 < local_278 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_2e4 = local_2e4 + 1) {
    for (local_2e8 = 0; local_2e8 < local_274; local_2e8 = local_2e8 + 1) {
      *(undefined4 *)((long)local_2c8 + (long)((local_274 + -1) - local_2e8) * 4) =
           *(undefined4 *)((long)&local_2e0->_vptr_Allocator + (long)local_2e8 * 4);
    }
    local_2e0 = (Allocator *)((long)&local_2e0->_vptr_Allocator + (long)local_274 * 4);
    local_2c8 = (void *)((long)local_2c8 + (long)local_274 * 4);
  }
  local_2ec = 1;
  local_2f0 = 1;
  if ((local_270[0x27] & 1) != 0) {
    if (local_278 % 8 == 0) {
      local_414 = 8;
    }
    else {
      local_414 = 1;
      if (local_278 % 4 == 0) {
        local_414 = 4;
      }
    }
    local_2ec = local_414;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
      local_418 = 8;
    }
    else {
      local_418 = 1;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
        local_418 = 4;
      }
    }
    local_2f0 = local_418;
  }
  Mat::reshape((Mat *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               in_stack_fffffffffffffc64,in_stack_fffffffffffffc60,iVar8,in_stack_fffffffffffffc50);
  Mat::create(in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
              (int)in_stack_fffffffffffffb88,iVar9,
              CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),iVar10,_allocator);
  for (local_33c = 0;
      local_33c + local_2f0 + -1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_33c = local_2f0 + local_33c) {
    local_208 = in_RDI + 1;
    local_20c = local_33c / local_2f0;
    local_200 = &local_390;
    local_bc = *(int *)((long)in_RDI + 0x34);
    local_c0 = (int)in_RDI[7];
    local_c4 = *(undefined4 *)((long)in_RDI + 0x3c);
    local_d0 = (undefined4 *)(*local_208 + in_RDI[9] * (long)local_20c * in_RDI[3]);
    local_d8 = in_RDI[3];
    local_dc = (undefined4)in_RDI[4];
    local_e8 = in_RDI[5];
    local_b8 = &local_390;
    local_60 = (long)local_bc * (long)local_c0 * local_d8;
    local_240 = &local_390;
    local_1e8 = &local_390;
    local_64 = 0x10;
    local_20d = 1;
    local_390 = 0;
    local_380 = 0;
    local_378 = 0;
    local_368 = 0;
    local_364 = 0;
    local_360 = 0;
    local_35c = 0;
    local_358 = 0;
    local_350 = 0;
    local_388 = 0;
    local_348 = local_d0;
    for (iVar10 = 0; iVar10 + local_2ec + -1 < local_278; iVar10 = local_2ec + iVar10) {
      for (iVar9 = 0; iVar9 < local_274; iVar9 = iVar9 + 1) {
        for (iVar8 = 0; iVar8 < local_2ec; iVar8 = iVar8 + 1) {
          for (iVar7 = 0; iVar7 < local_2f0; iVar7 = iVar7 + 1) {
            local_224 = local_33c + iVar7;
            local_218 = &local_3f0;
            local_220 = &local_338;
            local_98 = (void *)((long)local_338 + local_2f8 * local_224 * local_328);
            local_80 = &local_3f0;
            local_70 = (long)local_30c * (long)local_308 * local_328;
            local_1a4 = iVar10 + iVar8;
            local_1a0 = &local_3f0;
            local_1d8 = &local_3f0;
            local_74 = 0x10;
            local_225 = 1;
            local_3f0 = 0;
            local_3c8 = 0;
            local_3bc = 0;
            local_3e8 = 0;
            *local_348 = *(undefined4 *)
                          ((long)local_98 +
                          (long)iVar9 * 4 + (long)local_30c * (long)local_1a4 * local_328);
            local_348 = local_348 + 1;
            local_140 = local_1d8;
          }
        }
      }
    }
    local_120 = local_1e8;
    local_370 = local_e8;
  }
  ppvVar6 = &local_338;
  local_1c8 = ppvVar6;
  local_160 = ppvVar6;
  if (local_330 != (int *)0x0) {
    local_164 = 0xffffffff;
    LOCK();
    local_168 = *local_330;
    *local_330 = *local_330 + -1;
    UNLOCK();
    if (local_168 == 1) {
      if (local_318 == (long *)0x0) {
        if (local_338 != (void *)0x0) {
          free(local_338);
        }
      }
      else {
        (**(code **)(*local_318 + 0x18))(local_318,local_338);
      }
    }
  }
  *ppvVar6 = (void *)0x0;
  ppvVar6[2] = (void *)0x0;
  *(undefined4 *)(ppvVar6 + 3) = 0;
  *(undefined4 *)(ppvVar6 + 5) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
  *(undefined4 *)(ppvVar6 + 6) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
  *(undefined4 *)(ppvVar6 + 7) = 0;
  ppvVar6[8] = (void *)0x0;
  ppvVar6[1] = (void *)0x0;
  if ((*local_270 & 1) != 0) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar5 = (undefined8 *)((long)in_RDI + lVar1 + 0x160);
    local_f0 = puVar5;
    if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
      piVar2 = *(int **)((long)in_RDI + lVar1 + 0x168);
      local_f4 = 0xffffffff;
      LOCK();
      local_f8 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_f8 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x180) == 0) {
          local_58 = (void *)*puVar5;
          if (local_58 != (void *)0x0) {
            free(local_58);
          }
        }
        else {
          plVar3 = *(long **)((long)in_RDI + lVar1 + 0x180);
          (**(code **)(*plVar3 + 0x18))(plVar3,*puVar5);
        }
      }
    }
    *puVar5 = 0;
    puVar5[2] = 0;
    *(undefined4 *)(puVar5 + 3) = 0;
    *(undefined4 *)(puVar5 + 5) = 0;
    *(undefined4 *)((long)puVar5 + 0x2c) = 0;
    *(undefined4 *)(puVar5 + 6) = 0;
    *(undefined4 *)((long)puVar5 + 0x34) = 0;
    *(undefined4 *)(puVar5 + 7) = 0;
    puVar5[8] = 0;
    puVar5[1] = 0;
  }
  ppvVar6 = &local_2c0;
  if (local_2b8 != (int *)0x0) {
    local_184 = 0xffffffff;
    LOCK();
    local_188 = *local_2b8;
    *local_2b8 = *local_2b8 + -1;
    UNLOCK();
    if (local_188 == 1) {
      local_1b8 = ppvVar6;
      local_180 = ppvVar6;
      if (local_2a0 == (long *)0x0) {
        local_10 = local_2c0;
        if (local_2c0 != (void *)0x0) {
          free(local_2c0);
        }
      }
      else {
        (**(code **)(*local_2a0 + 0x18))(local_2a0,local_2c0);
      }
    }
  }
  *ppvVar6 = (void *)0x0;
  ppvVar6[2] = (void *)0x0;
  *(undefined4 *)(ppvVar6 + 3) = 0;
  *(undefined4 *)(ppvVar6 + 5) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
  *(undefined4 *)(ppvVar6 + 6) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
  *(undefined4 *)(ppvVar6 + 7) = 0;
  ppvVar6[8] = (void *)0x0;
  ppvVar6[1] = (void *)0x0;
  return 0;
}

Assistant:

int Deconvolution_x86_avx::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    Mat weight_data_transposed(weight_data.w);
    {
        float* pt = weight_data_transposed;
        const float* p = weight_data;

        for (int i = 0; i < num_input * num_output; i++)
        {
            for (int k = 0; k < maxk; k++)
            {
                pt[maxk - 1 - k] = p[k];
            }

            p += maxk;
            pt += maxk;
        }
    }

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}